

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O1

void pnga_set_chunk(Integer g_a,Integer *chunk)

{
  short sVar1;
  global_array_t *pgVar2;
  long lVar3;
  long lVar4;
  
  lVar4 = g_a + 1000;
  if (GA[g_a + 1000].actv == 1) {
    pnga_error("Cannot set chunk on array that has been allocated",0);
  }
  if (GA[lVar4].ndim < 1) {
    pnga_error("Dimensions must be set before chunk array is specified",0);
  }
  pgVar2 = GA;
  if (chunk != (Integer *)0x0) {
    sVar1 = GA[lVar4].ndim;
    if (0 < (long)sVar1) {
      lVar3 = 0;
      do {
        pgVar2[lVar4].chunk[lVar3] = chunk[lVar3];
        lVar3 = lVar3 + 1;
      } while (sVar1 != lVar3);
    }
  }
  return;
}

Assistant:

void pnga_set_chunk(Integer g_a, Integer *chunk)
{
  Integer i;
  Integer ga_handle = g_a + GA_OFFSET;
  if (GA[ga_handle].actv == 1)
    pnga_error("Cannot set chunk on array that has been allocated",0);
  if (GA[ga_handle].ndim < 1)
    pnga_error("Dimensions must be set before chunk array is specified",0);
  if (chunk) {
    for (i=0; i<GA[ga_handle].ndim; i++) {
      GA[ga_handle].chunk[i] = (C_Integer)chunk[i];
    }
  }
}